

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

void Diligent::LinuxFileSystem::ClearDirectory(Char *strPath,bool Recursive)

{
  char *__dir;
  _func_int_char_ptr_stat_ptr_int_FTW_ptr *local_78;
  __1 local_5a;
  __0 local_59;
  _func_int_char_ptr_stat_ptr_int_FTW_ptr *local_58;
  _func_int_char_ptr_stat_ptr_int_FTW_ptr *Callaback;
  allocator local_39;
  undefined1 local_38 [8];
  string path;
  bool Recursive_local;
  Char *strPath_local;
  
  path.field_2._M_local_buf[0xf] = Recursive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,strPath,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  BasicFileSystem::CorrectSlashes((String *)local_38,'\0');
  if ((path.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_78 = ClearDirectory(char_const*,bool)::$_1::operator_cast_to_function_pointer(&local_5a);
  }
  else {
    local_78 = ClearDirectory(char_const*,bool)::$_0::operator_cast_to_function_pointer(&local_59);
  }
  local_58 = local_78;
  __dir = (char *)std::__cxx11::string::c_str();
  nftw(__dir,(__nftw_func_t)local_58,0x20,0xb);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void LinuxFileSystem::ClearDirectory(const Char* strPath, bool Recursive)
{
    std::string path{strPath};
    LinuxFileSystem::CorrectSlashes(path);

    auto Callaback = Recursive ?
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            if (pFTWB->level >= 1)
                return remove(Path);
            else
                return 0;
        } :
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            if (pFTWB->level == 1 && !S_ISDIR(pStat->st_mode))
                return remove(Path);
            else
                return 0;
        };

    nftw(path.c_str(), Callaback, MaxOpenNTFWDescriptors, FTW_DEPTH | FTW_MOUNT | FTW_PHYS);
}